

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O3

void output_velocities(FILE *fdf,char *s,float (*full_velocities) [512] [2],int pic_x,int pic_y,
                      int n)

{
  float fVar1;
  long lVar2;
  FILE *__s;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  void *__ptr;
  float y;
  float x;
  float local_5c;
  size_t local_58;
  int local_50;
  int local_4c;
  FILE *local_48;
  char *local_40;
  float local_34;
  
  if (fdf == (FILE *)0x0) {
    puts("\nFatal error: full velocity file not opened");
    exit(1);
  }
  local_5c = (float)pic_x;
  local_34 = (float)pic_y;
  local_58 = CONCAT44(local_58._4_4_,pic_x);
  local_40 = s;
  fwrite(&local_34,4,1,(FILE *)fdf);
  fwrite(&local_5c,4,1,(FILE *)fdf);
  iVar11 = (int)local_58 + n * -2;
  local_5c = (float)iVar11;
  local_50 = pic_y + n * -2;
  local_34 = (float)local_50;
  local_4c = pic_y;
  fwrite(&local_34,4,1,(FILE *)fdf);
  fwrite(&local_5c,4,1,(FILE *)fdf);
  local_5c = (float)n;
  local_34 = local_5c;
  fwrite(&local_34,4,1,(FILE *)fdf);
  local_48 = (FILE *)fdf;
  fwrite(&local_5c,4,1,(FILE *)fdf);
  __s = local_48;
  iVar10 = (int)local_58 - n;
  uVar12 = 0x18;
  uVar7 = 0;
  if (n < iVar10) {
    lVar4 = (long)n;
    lVar6 = (long)full_velocities + lVar4 * 0x1008 + 4;
    lVar2 = lVar4 * -2;
    uVar7 = 0;
    uVar8 = 0;
    do {
      if (n < local_4c - n) {
        lVar9 = 0;
        do {
          fVar1 = *(float *)(lVar6 + -4 + lVar9 * 8);
          if (((fVar1 == 100.0) && (!NAN(fVar1))) ||
             ((fVar1 = *(float *)(lVar6 + lVar9 * 8), fVar1 == 100.0 && (!NAN(fVar1))))) {
            uVar8 = uVar8 + 1;
          }
          else {
            uVar7 = uVar7 + 1;
          }
          lVar9 = lVar9 + 1;
        } while (local_4c + lVar2 != lVar9);
      }
      lVar4 = lVar4 + 1;
      lVar6 = lVar6 + 0x1000;
    } while (lVar4 != iVar10);
    if (n < iVar10) {
      local_58 = (size_t)(local_50 * 2);
      __ptr = (void *)((long)full_velocities + (long)n * 0x1008);
      uVar12 = 0x18;
      do {
        sVar5 = fwrite(__ptr,4,local_58,__s);
        uVar12 = uVar12 + (int)sVar5;
        __ptr = (void *)((long)__ptr + 0x1000);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
  }
  else {
    uVar8 = 0;
  }
  fclose(local_48);
  pcVar3 = local_40;
  printf("\n%s velocities output from output_velocities: %d velocities\n",local_40,(ulong)uVar12);
  printf("Number of positions with velocity: %d\n",(ulong)uVar7);
  printf("Number of positions without velocity: %d\n",(ulong)uVar8);
  printf("Percentage of %s velocities: %f\n",
         ((double)(int)uVar7 / (double)(int)(uVar7 + uVar8)) * 100.0,pcVar3);
  fflush(_stdout);
  return;
}

Assistant:

void output_velocities(FILE *fdf, char s[],
float full_velocities[PIC_X][PIC_Y][2],
int pic_x, int pic_y,
int n)
{
float x,y;
int i,j,bytes,no_novals,no_vals;

//int NORMAL = FALSE;
//if(strcmp(s,"Normal")==0) NORMAL = TRUE;
if(fdf==NULL)
	{
	printf("\nFatal error: full velocity file not opened\n");
	exit(1);
	}
/* original size */
y = (float) pic_x;
x = (float) pic_y;
fwrite(&x,4, 1, fdf);
fwrite(&y,4, 1, fdf);

/* size of result data */
y = (float) (pic_x-2*n);
x = (float) (pic_y-2*n);
fwrite(&x,4, 1, fdf);
fwrite(&y,4, 1, fdf);

/* offset to start of data */
y = (float) n;
x = (float) n;
fwrite(&x,4, 1, fdf);
fwrite(&y,4, 1, fdf);
bytes = 24;

no_novals = no_vals = 0;
/* Prepare velocities for output, i.e. rotate by 90 degrees */
for(i=n;i<pic_x-n;i++)
for(j=n;j<pic_y-n;j++)
	{
	if(full_velocities[i][j][0] != NO_VALUE &&
	   full_velocities[i][j][1] != NO_VALUE)
		{
		no_vals++;
		}
	else
		{
		no_novals++;
		}
	}
for(i=n;i<pic_x-n;i++)
	{
	bytes += fwrite(&full_velocities[i][n][0], 4, (pic_y-2*n)*2, fdf);
	}
fclose(fdf);
printf("\n%s velocities output from output_velocities: %d velocities\n",s,bytes);
printf("Number of positions with velocity: %d\n",no_vals);
printf("Number of positions without velocity: %d\n",no_novals);
printf("Percentage of %s velocities: %f\n",s,
	no_vals/(1.0*(no_vals+no_novals))*100.0);
fflush(stdout);
}